

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_unittest.cc
# Opt level: O2

void CheckStackTrace2(int i)

{
  string *psVar1;
  int j;
  void *ra;
  CheckOpString local_70;
  LogMessage local_68;
  
  psVar1 = google::Check_LTImpl<void_const*,void*>
                     (&expected_range[4].start,(void **)&stack0xffffffffffffff88,
                      "(&expected_range[4])->start < ra");
  if (psVar1 == (string *)0x0) {
    if (expected_range[4].end < ra) {
      printf("Adjusting range from %p..%p to %p..%p\n",expected_range[4].start);
      expected_range[4].end = ra;
    }
    expected_range[3].start = (void *)0x10888f;
    expected_range[3].end = (void *)0x10889e;
    psVar1 = google::Check_LTImpl<void_const*,void_const*>
                       (&expected_range[3].start,&expected_range[3].end,
                        "(&expected_range[3])->start < (&expected_range[3])->end");
    if (psVar1 == (string *)0x0) {
      for (; -1 < i; i = i + -1) {
        CheckStackTrace3(i);
      }
      return;
    }
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stacktrace_unittest.cc"
               ,0xbe,(CheckOpString *)&stack0xffffffffffffff88);
    google::LogMessage::stream(&local_68);
  }
  else {
    local_70.str_ = psVar1;
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/stacktrace_unittest.cc"
               ,0xbd,&local_70);
    google::LogMessage::stream(&local_68);
  }
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_68);
}

Assistant:

static void ATTRIBUTE_NOINLINE CheckStackTrace2(int i) {
  ADJUST_ADDRESS_RANGE_FROM_RA(&expected_range[4]);
  INIT_ADDRESS_RANGE(CheckStackTrace2, start, end, &expected_range[3]);
  DECLARE_ADDRESS_LABEL(start);
  for (int j = i; j >= 0; j--) {
    CheckStackTrace3(j);
  }
  DECLARE_ADDRESS_LABEL(end);
}